

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode create_transfer(GlobalConfig *global,CURLSH *share,_Bool *added)

{
  CURLcode local_24;
  CURLcode result;
  _Bool *added_local;
  CURLSH *share_local;
  GlobalConfig *global_local;
  
  local_24 = CURLE_OK;
  *added = false;
  while (((global->current != (OperationConfig *)0x0 &&
          (local_24 = transfer_per_config(global,global->current,share,added), local_24 == CURLE_OK)
          ) && ((*added & 1U) == 0))) {
    global->current = global->current->next;
  }
  return local_24;
}

Assistant:

static CURLcode create_transfer(struct GlobalConfig *global,
                                CURLSH *share,
                                bool *added)
{
  CURLcode result = CURLE_OK;
  *added = FALSE;
  while(global->current) {
    result = transfer_per_config(global, global->current, share, added);
    if(!result && !*added) {
      /* when one set is drained, continue to next */
      global->current = global->current->next;
      continue;
    }
    break;
  }
  return result;
}